

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O0

void __thiscall
duckdb::StructColumnData::FetchRow
          (StructColumnData *this,TransactionData transaction,ColumnFetchState *state,row_t row_id,
          Vector *result,idx_t result_idx)

{
  TransactionData transaction_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  *this_00;
  size_type sVar1;
  size_type sVar2;
  pointer pCVar3;
  type pCVar4;
  type pVVar5;
  undefined8 in_RDX;
  long in_RSI;
  row_t in_RDI;
  undefined8 in_R8;
  idx_t i_1;
  templated_unique_single_t child_state;
  idx_t i;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *child_entries;
  Vector *in_stack_ffffffffffffff18;
  size_type __n;
  vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
  *in_stack_ffffffffffffff20;
  vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
  *this_01;
  Vector *result_00;
  ColumnFetchState *in_stack_ffffffffffffff78;
  size_type sVar6;
  ColumnData *in_stack_ffffffffffffff80;
  vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
  *pvVar7;
  undefined8 in_stack_ffffffffffffff90;
  ulong uVar8;
  ulong uVar9;
  size_type local_38;
  
  result_00 = (Vector *)&stack0x00000008;
  this_00 = &StructVector::GetEntries(in_stack_ffffffffffffff18)->
             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ;
  local_38 = ::std::
             vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
             ::size((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
                     *)(in_RSI + 0x38));
  while( true ) {
    sVar2 = local_38;
    sVar1 = ::std::
            vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ::size(this_00);
    if (sVar1 + 1 <= sVar2) break;
    make_uniq<duckdb::ColumnFetchState>();
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
    ::push_back(in_stack_ffffffffffffff20,(value_type *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
                 *)0xbba949);
    local_38 = local_38 + 1;
  }
  __n = *(size_type *)result_00;
  this_01 = *(vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
              **)&result_00->type;
  vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
                *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
  unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>::
  operator*((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
             *)in_stack_ffffffffffffff20);
  transaction_00.transaction_id = __n;
  transaction_00.transaction.ptr = (DuckTransaction *)in_stack_ffffffffffffff90;
  transaction_00.start_time = (transaction_t)this_01;
  ColumnData::FetchRow
            (in_stack_ffffffffffffff80,transaction_00,in_stack_ffffffffffffff78,in_RDI,result_00,
             sVar2);
  uVar8 = 0;
  while( true ) {
    uVar9 = uVar8;
    sVar2 = ::std::
            vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ::size(this_00);
    if (sVar2 <= uVar8) break;
    vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
    ::operator[](this_01,__n);
    pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                         *)this_01);
    sVar6 = *(size_type *)result_00;
    pvVar7 = *(vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
               **)&result_00->type;
    vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
                  *)this_01,__n);
    pCVar4 = unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
             ::operator*((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
                          *)this_01);
    vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
    operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                *)this_01,__n);
    __n = sVar6;
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        this_01);
    this_01 = pvVar7;
    (*pCVar3->_vptr_ColumnData[0x16])(pCVar3,pCVar4,in_RDX,pVVar5,in_R8);
    uVar8 = uVar9 + 1;
  }
  return;
}

Assistant:

void StructColumnData::FetchRow(TransactionData transaction, ColumnFetchState &state, row_t row_id, Vector &result,
                                idx_t result_idx) {
	// fetch validity mask
	auto &child_entries = StructVector::GetEntries(result);
	// insert any child states that are required
	for (idx_t i = state.child_states.size(); i < child_entries.size() + 1; i++) {
		auto child_state = make_uniq<ColumnFetchState>();
		state.child_states.push_back(std::move(child_state));
	}
	// fetch the validity state
	validity.FetchRow(transaction, *state.child_states[0], row_id, result, result_idx);
	// fetch the sub-column states
	for (idx_t i = 0; i < child_entries.size(); i++) {
		sub_columns[i]->FetchRow(transaction, *state.child_states[i + 1], row_id, *child_entries[i], result_idx);
	}
}